

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetString
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,string *value)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Type TVar4;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  FieldOptions *this_01;
  ArenaStringPtr *pAVar6;
  string *default_value;
  OneofDescriptor *pOVar7;
  Arena *arena;
  string *default_ptr;
  string *value_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetString",CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    TVar4 = FieldDescriptor::type(field);
    ExtensionSet::SetString(this_00,number,(FieldType)TVar4,value,field);
  }
  else {
    this_01 = FieldDescriptor::options(field);
    FieldOptions::ctype(this_01);
    pAVar6 = DefaultRaw<google::protobuf::internal::ArenaStringPtr>(this,field);
    default_value = ArenaStringPtr::Get_abi_cxx11_(pAVar6);
    pOVar7 = FieldDescriptor::containing_oneof(field);
    if ((pOVar7 != (OneofDescriptor *)0x0) && (bVar1 = HasOneofField(this,message,field), !bVar1)) {
      pOVar7 = FieldDescriptor::containing_oneof(field);
      ClearOneof(this,message,pOVar7);
      pAVar6 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
      ArenaStringPtr::UnsafeSetDefault(pAVar6,default_value);
    }
    pAVar6 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    arena = GetArena(this,message);
    ArenaStringPtr::Set(pAVar6,default_value,value,arena);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SetString(
    Message* message, const FieldDescriptor* field,
    const string& value) const {
  USAGE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(field->number(),
                                                   field->type(), value, field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        const string* default_ptr = &DefaultRaw<ArenaStringPtr>(field).Get();
        if (field->containing_oneof() && !HasOneofField(*message, field)) {
          ClearOneof(message, field->containing_oneof());
          MutableField<ArenaStringPtr>(message, field)->UnsafeSetDefault(
              default_ptr);
        }
        MutableField<ArenaStringPtr>(message, field)->Set(default_ptr,
            value, GetArena(message));
        break;
      }
    }
  }
}